

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::doReverse(UnicodeString *this,int32_t start,int32_t length)

{
  char16_t cVar1;
  char16_t cVar2;
  bool bVar3;
  UBool UVar4;
  long lVar5;
  char16_t *pcVar6;
  long lVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  bool bVar10;
  int32_t start_local;
  int32_t length_local;
  
  if (1 < length) {
    start_local = start;
    length_local = length;
    UVar4 = cloneArrayIfNeeded(this,-1,-1,'\x01',(int32_t **)0x0,'\0');
    if (UVar4 != '\0') {
      pinIndices(this,&start_local,&length_local);
      lVar5 = (long)length_local;
      if (1 < lVar5) {
        pcVar6 = (char16_t *)((long)&this->fUnion + 2);
        pcVar8 = pcVar6;
        if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
            (undefined1  [56])0x0) {
          pcVar8 = (this->fUnion).fFields.fArray;
        }
        lVar7 = (long)start_local;
        pcVar9 = pcVar8 + lVar7;
        bVar3 = false;
        pcVar8 = pcVar8 + lVar7 + lVar5 + -2;
        do {
          cVar1 = *pcVar9;
          cVar2 = pcVar8[1];
          *pcVar9 = cVar2;
          pcVar8[1] = cVar1;
          pcVar9 = pcVar9 + 1;
          bVar3 = (bool)(bVar3 | (cVar1 & 0xfc00U) == 0xd800U | (cVar2 & 0xfc00U) == 0xd800U);
          bVar10 = pcVar9 < pcVar8;
          pcVar8 = pcVar8 + -1;
        } while (bVar10);
        if (bVar3 || (*pcVar9 & 0xfc00U) == 0xd800) {
          if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
              (undefined1  [56])0x0) {
            pcVar6 = (this->fUnion).fFields.fArray;
          }
          pcVar6 = pcVar6 + lVar7;
          pcVar8 = pcVar6 + lVar5 + -1;
          while (pcVar6 < pcVar8) {
            cVar1 = *pcVar6;
            if (((cVar1 & 0xfc00U) == 0xdc00) && ((pcVar6[1] & 0xfc00U) == 0xd800)) {
              *pcVar6 = pcVar6[1];
              pcVar6[1] = cVar1;
              pcVar6 = pcVar6 + 2;
            }
            else {
              pcVar6 = pcVar6 + 1;
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::doReverse(int32_t start, int32_t length) {
  if(length <= 1 || !cloneArrayIfNeeded()) {
    return *this;
  }

  // pin the indices to legal values
  pinIndices(start, length);
  if(length <= 1) {  // pinIndices() might have shrunk the length
    return *this;
  }

  UChar *left = getArrayStart() + start;
  UChar *right = left + length - 1;  // -1 for inclusive boundary (length>=2)
  UChar swap;
  UBool hasSupplementary = FALSE;

  // Before the loop we know left<right because length>=2.
  do {
    hasSupplementary |= (UBool)U16_IS_LEAD(swap = *left);
    hasSupplementary |= (UBool)U16_IS_LEAD(*left++ = *right);
    *right-- = swap;
  } while(left < right);
  // Make sure to test the middle code unit of an odd-length string.
  // Redundant if the length is even.
  hasSupplementary |= (UBool)U16_IS_LEAD(*left);

  /* if there are supplementary code points in the reversed range, then re-swap their surrogates */
  if(hasSupplementary) {
    UChar swap2;

    left = getArrayStart() + start;
    right = left + length - 1; // -1 so that we can look at *(left+1) if left<right
    while(left < right) {
      if(U16_IS_TRAIL(swap = *left) && U16_IS_LEAD(swap2 = *(left + 1))) {
        *left++ = swap2;
        *left++ = swap;
      } else {
        ++left;
      }
    }
  }

  return *this;
}